

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

void invokeCallbacksOPTION
               (poptContext con,poptOption *opt,poptOption *myOpt,void *myData,int shorty)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  char *local_80;
  char *local_60;
  void *cbData;
  poptArg arg;
  poptArg cbarg;
  poptOption *cbopt;
  char *pcStack_28;
  int shorty_local;
  void *myData_local;
  poptOption *myOpt_local;
  poptOption *opt_local;
  poptContext con_local;
  
  cbarg.ptr = (void *)0x0;
  cbopt._4_4_ = shorty;
  pcStack_28 = (char *)myData;
  myData_local = myOpt;
  myOpt_local = opt;
  opt_local = (poptOption *)con;
  memset(&arg,0,8);
  if (myOpt_local != (poptOption *)0x0) {
    while( true ) {
      bVar3 = true;
      if ((myOpt_local->longName == (char *)0x0) && (bVar3 = true, myOpt_local->shortName == '\0'))
      {
        bVar3 = myOpt_local->arg != (void *)0x0;
      }
      if (!bVar3) break;
      uVar1 = myOpt_local->argInfo & _poptArgMask;
      if (uVar1 == 4) {
        if (myOpt_local->arg != (void *)0x0) {
          invokeCallbacksOPTION
                    ((poptContext)opt_local,(poptOption *)myOpt_local->arg,
                     (poptOption *)myData_local,pcStack_28,cbopt._4_4_);
        }
      }
      else if (uVar1 == 5) {
        if ((myOpt_local->argInfo & 0x10000000) == 0) {
          cbarg.opt = myOpt_local;
          arg = (poptArg)myOpt_local->arg;
        }
      }
      else if (((cbarg.ptr != (void *)0x0) && (arg.ptr != (void *)0x0)) &&
              (((*(char *)((long)myData_local + 8) != '\0' &&
                (((myOpt_local->shortName != '\0' && (cbopt._4_4_ != 0)) &&
                 (*(char *)((long)myData_local + 8) == myOpt_local->shortName)))) ||
               (((*myData_local != 0 && (myOpt_local->longName != (char *)0x0)) &&
                (iVar2 = strcmp(*myData_local,myOpt_local->longName), iVar2 == 0)))))) {
        if ((cbarg.opt)->descrip == (char *)0x0) {
          local_60 = pcStack_28;
        }
        else {
          local_60 = (cbarg.opt)->descrip;
        }
        if (*(int *)((long)myData_local + 0xc) == 0) {
          local_80 = (char *)0x0;
        }
        else {
          local_80 = *(char **)((long)opt_local[0xd].arg + 0x20);
        }
        (*arg.cb)((poptContext)opt_local,POPT_CALLBACK_REASON_OPTION,(poptOption *)myData_local,
                  local_80,local_60);
        if (((cbarg.opt)->argInfo & 0x8000000) == 0) {
          return;
        }
      }
      myOpt_local = myOpt_local + 1;
    }
  }
  return;
}

Assistant:

static void invokeCallbacksOPTION(poptContext con,
				const struct poptOption * opt,
				const struct poptOption * myOpt,
				const void * myData, int shorty)
{
    const struct poptOption * cbopt = NULL;
    poptArg cbarg = { .ptr = NULL };

    if (opt != NULL)
    for (; opt->longName || opt->shortName || opt->arg; opt++) {
	poptArg arg = { .ptr = opt->arg };
	switch (poptArgType(opt)) {
	case POPT_ARG_INCLUDE_TABLE:	/* Recurse on included sub-tables. */
	    poptSubstituteHelpI18N(arg.opt);	/* XXX side effects */
	    if (opt->arg != NULL)
		invokeCallbacksOPTION(con, opt->arg, myOpt, myData, shorty);
	    break;
	case POPT_ARG_CALLBACK:		/* Save callback info. */
	    if (CBF_ISSET(opt, SKIPOPTION))
		break;
	    cbopt = opt;
	    cbarg.ptr = opt->arg;
	    break;
	default:		/* Perform callback on matching option. */
	    if (cbopt == NULL || cbarg.cb == NULL)
		break;
	    if ((myOpt->shortName && opt->shortName && shorty &&
			myOpt->shortName == opt->shortName)
	     || (myOpt->longName != NULL && opt->longName != NULL &&
			!strcmp(myOpt->longName, opt->longName)))
	    {	const void *cbData = (cbopt->descrip ? cbopt->descrip : myData);
		cbarg.cb(con, POPT_CALLBACK_REASON_OPTION,
			myOpt, myOpt->argInfo ? con->os->nextArg : NULL, cbData);
		/* Terminate (unless explicitly continuing). */
		if (!CBF_ISSET(cbopt, CONTINUE))
		    return;
	    }
	    break;
	}
    }
}